

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O0

void anon_unknown.dwarf_4394bc::grain_equal(aom_film_grain_t *expected,aom_film_grain_t *actual)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper *this;
  long in_RSI;
  long in_RDI;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  int num_pos_chroma;
  int num_pos_luma;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffc10;
  int *in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  int line;
  char *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Type type;
  AssertHelper *in_stack_fffffffffffffc40;
  Message *in_stack_fffffffffffffc88;
  AssertHelper *in_stack_fffffffffffffc90;
  AssertionResult local_328 [2];
  AssertionResult local_308 [2];
  AssertionResult local_2e8 [2];
  AssertionResult local_2c8 [2];
  AssertionResult local_2a8 [2];
  AssertionResult local_288 [2];
  AssertionResult local_268 [2];
  AssertionResult local_248 [2];
  AssertionResult local_228 [2];
  int local_208;
  undefined4 local_204;
  AssertionResult local_200 [2];
  int local_1e0;
  undefined4 local_1dc;
  AssertionResult local_1d8 [2];
  int local_1b8;
  undefined4 local_1b4;
  AssertionResult local_1b0;
  int local_1a0;
  int local_19c;
  AssertionResult local_188 [2];
  AssertionResult local_168 [2];
  AssertionResult local_148 [2];
  int local_128;
  undefined4 local_124;
  AssertionResult local_120 [2];
  int local_100;
  undefined4 local_fc;
  AssertionResult local_f8 [2];
  int local_d8;
  undefined4 local_d4;
  AssertionResult local_d0 [2];
  AssertionResult local_b0 [2];
  AssertionResult local_90 [2];
  AssertionResult local_70 [2];
  AssertionResult local_50 [3];
  AssertionResult local_20;
  long local_10;
  long local_8;
  
  type = (Type)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (int *)in_stack_fffffffffffffc10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc40);
    testing::AssertionResult::failure_message((AssertionResult *)0x55df16);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
               (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
    testing::Message::~Message((Message *)0x55df79);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55dfe7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (int *)in_stack_fffffffffffffc10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc40);
    testing::AssertionResult::failure_message((AssertionResult *)0x55e060);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
               (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
    testing::Message::~Message((Message *)0x55e0c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55e12e);
  if (*(int *)(local_8 + 4) != 0) {
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55e1ba);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55e21d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55e28b);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55e30a);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55e36d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55e3db);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55e45a);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55e4bd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55e52e);
    local_d4 = 0;
    local_d8 = memcmp((void *)(local_8 + 8),(void *)(local_10 + 8),
                      (long)*(int *)(local_8 + 0x78) << 3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55e5de);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55e641);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55e6b2);
    local_fc = 0;
    local_100 = memcmp((void *)(local_8 + 0x7c),(void *)(local_10 + 0x7c),
                       (long)*(int *)(local_8 + 0xcc) << 3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      in_stack_fffffffffffffc90 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x55e765);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55e7c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55e839);
    local_124 = 0;
    local_128 = memcmp((void *)(local_8 + 0xd0),(void *)(local_10 + 0xd0),
                       (long)*(int *)(local_8 + 0x120) << 3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      in_stack_fffffffffffffc88 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x55e8f2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55e955);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55e9c3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55ea42);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55ea9f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55eb0d);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55eb8c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55ebe9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55ec57);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55ecd6);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55ed33);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55eda4);
    local_1a0 = *(int *)(local_8 + 0x128) * 2 * (*(int *)(local_8 + 0x128) + 1);
    local_1b4 = 0;
    local_19c = local_1a0;
    local_1b8 = memcmp((void *)(local_8 + 300),(void *)(local_10 + 300),(long)local_1a0 << 2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55ee8f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55eeec);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55ef5d);
    if ((*(int *)(local_10 + 0xcc) != 0) || (*(int *)(local_10 + 0x27c) != 0)) {
      local_1dc = 0;
      local_1e0 = memcmp((void *)(local_8 + 0x18c),(void *)(local_10 + 0x18c),(long)local_1a0 << 2);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        testing::AssertionResult::failure_message((AssertionResult *)0x55f035);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                   (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
        testing::Message::~Message((Message *)0x55f092);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55f0fd);
    }
    if ((*(int *)(local_10 + 0x120) != 0) || (*(int *)(local_10 + 0x27c) != 0)) {
      local_204 = 0;
      local_208 = memcmp((void *)(local_8 + 0x1f0),(void *)(local_10 + 0x1f0),(long)local_1a0 << 2);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        testing::AssertionResult::failure_message((AssertionResult *)0x55f1d7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                   (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
        testing::Message::~Message((Message *)0x55f234);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55f29f);
    }
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55f320);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55f37d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55f3eb);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      testing::AssertionResult::failure_message((AssertionResult *)0x55f46a);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55f4c7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55f535);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc40);
      in_stack_fffffffffffffc40 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x55f5b4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                 (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
      testing::Message::~Message((Message *)0x55f611);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55f67f);
    if (*(int *)(local_8 + 0xcc) != 0) {
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_288);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x55f713);
        type = (Type)((ulong)pcVar2 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                   (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
        testing::Message::~Message((Message *)0x55f770);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55f7de);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        in_stack_fffffffffffffc30 =
             testing::AssertionResult::failure_message((AssertionResult *)0x55f85d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                   (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
        testing::Message::~Message((Message *)0x55f8ba);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55f928);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        in_stack_fffffffffffffc28 =
             testing::AssertionResult::failure_message((AssertionResult *)0x55f9a7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                   (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
        testing::Message::~Message((Message *)0x55fa04);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55fa6f);
    }
    if (*(int *)(local_8 + 0x120) != 0) {
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        in_stack_fffffffffffffc20 =
             testing::AssertionResult::failure_message((AssertionResult *)0x55fb05);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                   (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
        testing::Message::~Message((Message *)0x55fb62);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55fbd0);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        in_stack_fffffffffffffc18 =
             (int *)testing::AssertionResult::failure_message((AssertionResult *)0x55fc4f);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,
                   (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffc10);
        testing::Message::~Message((Message *)0x55fcac);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55fd1a);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (int *)in_stack_fffffffffffffc10);
      line = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_328);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc40);
        this = (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x55fd99);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc40,type,in_stack_fffffffffffffc30,line,
                   in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        testing::internal::AssertHelper::~AssertHelper(this);
        testing::Message::~Message((Message *)0x55fdf6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x55fe61);
    }
  }
  return;
}

Assistant:

void grain_equal(const aom_film_grain_t *expected,
                 const aom_film_grain_t *actual) {
  EXPECT_EQ(expected->apply_grain, actual->apply_grain);
  EXPECT_EQ(expected->update_parameters, actual->update_parameters);
  if (!expected->update_parameters) return;
  EXPECT_EQ(expected->num_y_points, actual->num_y_points);
  EXPECT_EQ(expected->num_cb_points, actual->num_cb_points);
  EXPECT_EQ(expected->num_cr_points, actual->num_cr_points);
  EXPECT_EQ(0, memcmp(expected->scaling_points_y, actual->scaling_points_y,
                      expected->num_y_points *
                          sizeof(expected->scaling_points_y[0])));
  EXPECT_EQ(0, memcmp(expected->scaling_points_cb, actual->scaling_points_cb,
                      expected->num_cb_points *
                          sizeof(expected->scaling_points_cb[0])));
  EXPECT_EQ(0, memcmp(expected->scaling_points_cr, actual->scaling_points_cr,
                      expected->num_cr_points *
                          sizeof(expected->scaling_points_cr[0])));
  EXPECT_EQ(expected->scaling_shift, actual->scaling_shift);
  EXPECT_EQ(expected->ar_coeff_lag, actual->ar_coeff_lag);
  EXPECT_EQ(expected->ar_coeff_shift, actual->ar_coeff_shift);

  const int num_pos_luma =
      2 * expected->ar_coeff_lag * (expected->ar_coeff_lag + 1);
  const int num_pos_chroma = num_pos_luma;
  EXPECT_EQ(0, memcmp(expected->ar_coeffs_y, actual->ar_coeffs_y,
                      sizeof(expected->ar_coeffs_y[0]) * num_pos_luma));
  if (actual->num_cb_points || actual->chroma_scaling_from_luma) {
    EXPECT_EQ(0, memcmp(expected->ar_coeffs_cb, actual->ar_coeffs_cb,
                        sizeof(expected->ar_coeffs_cb[0]) * num_pos_chroma));
  }
  if (actual->num_cr_points || actual->chroma_scaling_from_luma) {
    EXPECT_EQ(0, memcmp(expected->ar_coeffs_cr, actual->ar_coeffs_cr,
                        sizeof(expected->ar_coeffs_cr[0]) * num_pos_chroma));
  }
  EXPECT_EQ(expected->overlap_flag, actual->overlap_flag);
  EXPECT_EQ(expected->chroma_scaling_from_luma,
            actual->chroma_scaling_from_luma);
  EXPECT_EQ(expected->grain_scale_shift, actual->grain_scale_shift);
  // EXPECT_EQ(expected->random_seed, actual->random_seed);

  // clip_to_restricted and bit_depth aren't written
  if (expected->num_cb_points) {
    EXPECT_EQ(expected->cb_mult, actual->cb_mult);
    EXPECT_EQ(expected->cb_luma_mult, actual->cb_luma_mult);
    EXPECT_EQ(expected->cb_offset, actual->cb_offset);
  }
  if (expected->num_cr_points) {
    EXPECT_EQ(expected->cr_mult, actual->cr_mult);
    EXPECT_EQ(expected->cr_luma_mult, actual->cr_luma_mult);
    EXPECT_EQ(expected->cr_offset, actual->cr_offset);
  }
}